

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O0

bool dxil_spv::emit_wmma_store(Impl *impl)

{
  bool bVar1;
  Id IVar2;
  Builder *this;
  Value *pVVar3;
  Value *stride;
  Operation *this_00;
  WMMAAccessChain WVar4;
  Operation *store;
  uint32_t local_40;
  Id local_34;
  Id IStack_30;
  WMMAAccessChain chain;
  bool column_major;
  uint32_t type_immediate;
  Builder *builder;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  pVVar3 = LLVMBC::Instruction::getOperand
                     (&(impl->ags).backdoor_instructions[5]->super_Instruction,5);
  if (pVVar3 == (impl->ags).active_read_backdoor) {
    if ((impl->ags).instructions[0].phase == 0) {
      if ((impl->ags).instructions[5].phase == 2) {
        bVar1 = validate_wmma_io_registers
                          (impl,1,AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg,1,true);
        if (bVar1) {
          chain.alignment._0_1_ = (char)(impl->ags).instructions[5].immediate;
          pVVar3 = LLVMBC::Instruction::getOperand
                             (&(impl->ags).backdoor_instructions[0]->super_Instruction,5);
          stride = LLVMBC::Instruction::getOperand
                             (&(impl->ags).backdoor_instructions[0]->super_Instruction,6);
          WVar4 = build_wmma_access_chain(impl,pVVar3,stride);
          local_40 = WVar4.alignment;
          local_34 = WVar4.chain_id;
          if (local_34 == 0) {
            impl_local._7_1_ = false;
          }
          else {
            this_00 = Converter::Impl::allocate(impl,OpCooperativeMatrixStoreKHR);
            Operation::add_id(this_00,local_34);
            pVVar3 = LLVMBC::Instruction::getOperand
                               (&(impl->ags).backdoor_instructions[1]->super_Instruction,5);
            IVar2 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
            Operation::add_id(this_00,IVar2);
            IVar2 = spv::Builder::makeUintConstant(this,(uint)((char)chain.alignment < '\0'),false);
            Operation::add_id(this_00,IVar2);
            IStack_30 = WVar4.stride_id;
            Operation::add_id(this_00,IStack_30);
            if (local_40 != 0) {
              Operation::add_literal(this_00,2);
              Operation::add_literal(this_00,local_40);
            }
            Converter::Impl::add(impl,this_00,false);
            impl_local._7_1_ = true;
          }
        }
        else {
          impl_local._7_1_ = false;
        }
      }
      else {
        impl_local._7_1_ = false;
      }
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

static bool emit_wmma_store(Converter::Impl &impl)
{
	auto &builder = impl.builder();

	// Sanity check that we're reading from the hooked read opcode.
	if (impl.ags.backdoor_instructions[5]->getOperand(5) != impl.ags.active_read_backdoor)
		return false;

	if (impl.ags.instructions[0].phase != 0)
		return false;
	if (impl.ags.instructions[5].phase != 2)
		return false;

	if (!validate_wmma_io_registers(impl, 1, AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg, 1, true))
		return false;

	uint32_t type_immediate = impl.ags.instructions[5].immediate;
	bool column_major = ((type_immediate >> AmdExtD3DShaderIntrinsicsWaveMatrixModifier_LayoutFlagShift) &
	                     AmdExtD3DShaderIntrinsicsWaveMatrixModifier_LayoutFlagMask) != 0;

	auto chain = build_wmma_access_chain(impl, impl.ags.backdoor_instructions[0]->getOperand(5),
	                                     impl.ags.backdoor_instructions[0]->getOperand(6));

	if (chain.chain_id == 0)
		return false;

	auto *store = impl.allocate(spv::OpCooperativeMatrixStoreKHR);
	store->add_id(chain.chain_id);
	store->add_id(impl.get_id_for_value(impl.ags.backdoor_instructions[1]->getOperand(5)));
	store->add_id(builder.makeUintConstant(
		column_major ? spv::CooperativeMatrixLayoutColumnMajorKHR : spv::CooperativeMatrixLayoutRowMajorKHR));
	store->add_id(chain.stride_id);

	if (chain.alignment)
	{
		store->add_literal(spv::MemoryAccessAlignedMask);
		store->add_literal(chain.alignment);
	}

	impl.add(store);

	return true;
}